

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::compactTrie
          (MutableCodePointTrie *this,int32_t fastILimit,UErrorCode *errorCode)

{
  uint32_t uVar1;
  UChar32 UVar2;
  uint uVar3;
  int32_t dataNullIndex_00;
  int32_t iVar4;
  uint32_t *newData_00;
  int32_t indexLength;
  int32_t newDataLength;
  int32_t dataNullIndex;
  uint32_t *newData;
  int32_t newDataCapacity;
  AllSameBlocks allSameBlocks;
  int32_t i_1;
  uint32_t asciiData [128];
  int32_t i;
  UChar32 fastLimit;
  int32_t realHighStart;
  UErrorCode *errorCode_local;
  int32_t fastILimit_local;
  MutableCodePointTrie *this_local;
  
  uVar1 = get(this,0x10ffff);
  this->highValue = uVar1;
  UVar2 = findHighStart(this);
  uVar3 = UVar2 + 0x1ffU & 0xfffffe00;
  if (uVar3 == 0x110000) {
    this->highValue = this->initialValue;
  }
  if ((int)uVar3 < fastILimit << 4) {
    for (asciiData[0x7f] = (int)uVar3 >> 4; (int)asciiData[0x7f] < fastILimit;
        asciiData[0x7f] = asciiData[0x7f] + 1) {
      this->flags[(int)asciiData[0x7f]] = '\0';
      this->index[(int)asciiData[0x7f]] = this->highValue;
    }
    this->highStart = fastILimit << 4;
  }
  else {
    this->highStart = uVar3;
  }
  for (allSameBlocks.refCounts[0x1e] = 0; allSameBlocks.refCounts[0x1e] < 0x80;
      allSameBlocks.refCounts[0x1e] = allSameBlocks.refCounts[0x1e] + 1) {
    uVar1 = get(this,allSameBlocks.refCounts[0x1e]);
    allSameBlocks.refCounts[(long)allSameBlocks.refCounts[0x1e] + 0x1f] = uVar1;
  }
  AllSameBlocks::AllSameBlocks((AllSameBlocks *)((long)&newData + 4));
  newData._0_4_ = compactWholeDataBlocks(this,fastILimit,(AllSameBlocks *)((long)&newData + 4));
  if ((int32_t)newData < 0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    this_local._4_4_ = 0;
  }
  else {
    newData_00 = (uint32_t *)uprv_malloc_63((long)((int32_t)newData << 2));
    if (newData_00 == (uint32_t *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      memcpy(newData_00,allSameBlocks.refCounts + 0x1f,0x200);
      dataNullIndex_00 = AllSameBlocks::findMostUsed((AllSameBlocks *)((long)&newData + 4));
      iVar4 = compactData(this,fastILimit,newData_00,dataNullIndex_00);
      uprv_free_63(this->data);
      this->data = newData_00;
      this->dataCapacity = (int32_t)newData;
      this->dataLength = iVar4;
      if (this->dataLength < 0x40010) {
        if (dataNullIndex_00 < 0) {
          this->dataNullOffset = 0xfffff;
        }
        else {
          this->dataNullOffset = this->index[dataNullIndex_00];
          this->initialValue = this->data[this->dataNullOffset];
        }
        this_local._4_4_ = compactIndex(this,fastILimit,errorCode);
        this->highStart = uVar3;
      }
      else {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t MutableCodePointTrie::compactTrie(int32_t fastILimit, UErrorCode &errorCode) {
    // Find the real highStart and round it up.
    U_ASSERT((highStart & (UCPTRIE_CP_PER_INDEX_2_ENTRY - 1)) == 0);
    highValue = get(MAX_UNICODE);
    int32_t realHighStart = findHighStart();
    realHighStart = (realHighStart + (UCPTRIE_CP_PER_INDEX_2_ENTRY - 1)) &
        ~(UCPTRIE_CP_PER_INDEX_2_ENTRY - 1);
    if (realHighStart == UNICODE_LIMIT) {
        highValue = initialValue;
    }

#ifdef UCPTRIE_DEBUG
    printf("UCPTrie: highStart U+%06lx  highValue 0x%lx  initialValue 0x%lx\n",
            (long)realHighStart, (long)highValue, (long)initialValue);
#endif

    // We always store indexes and data values for the fast range.
    // Pin highStart to the top of that range while building.
    UChar32 fastLimit = fastILimit << UCPTRIE_SHIFT_3;
    if (realHighStart < fastLimit) {
        for (int32_t i = (realHighStart >> UCPTRIE_SHIFT_3); i < fastILimit; ++i) {
            flags[i] = ALL_SAME;
            index[i] = highValue;
        }
        highStart = fastLimit;
    } else {
        highStart = realHighStart;
    }

    uint32_t asciiData[ASCII_LIMIT];
    for (int32_t i = 0; i < ASCII_LIMIT; ++i) {
        asciiData[i] = get(i);
    }

    // First we look for which data blocks have the same value repeated over the whole block,
    // deduplicate such blocks, find a good null data block (for faster enumeration),
    // and get an upper bound for the necessary data array length.
    AllSameBlocks allSameBlocks;
    int32_t newDataCapacity = compactWholeDataBlocks(fastILimit, allSameBlocks);
    if (newDataCapacity < 0) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    uint32_t *newData = (uint32_t *)uprv_malloc(newDataCapacity * 4);
    if (newData == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    uprv_memcpy(newData, asciiData, sizeof(asciiData));

    int32_t dataNullIndex = allSameBlocks.findMostUsed();
    int32_t newDataLength = compactData(fastILimit, newData, dataNullIndex);
    U_ASSERT(newDataLength <= newDataCapacity);
    uprv_free(data);
    data = newData;
    dataCapacity = newDataCapacity;
    dataLength = newDataLength;
    if (dataLength > (0x3ffff + UCPTRIE_SMALL_DATA_BLOCK_LENGTH)) {
        // The offset of the last data block is too high to be stored in the index table.
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    if (dataNullIndex >= 0) {
        dataNullOffset = index[dataNullIndex];
#ifdef UCPTRIE_DEBUG
        if (data[dataNullOffset] != initialValue) {
            printf("UCPTrie initialValue %lx -> more common nullValue %lx\n",
                   (long)initialValue, (long)data[dataNullOffset]);
        }
#endif
        initialValue = data[dataNullOffset];
    } else {
        dataNullOffset = UCPTRIE_NO_DATA_NULL_OFFSET;
    }

    int32_t indexLength = compactIndex(fastILimit, errorCode);
    highStart = realHighStart;
    return indexLength;
}